

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ParserResult * __thiscall
Catch::clara::detail::BoundFlagRef::setFlag
          (ParserResult *__return_storage_ptr__,BoundFlagRef *this,bool flag)

{
  ParseResultType local_20;
  undefined1 local_19;
  BoundFlagRef *pBStack_18;
  bool flag_local;
  BoundFlagRef *this_local;
  
  *this->m_ref = flag;
  local_20 = Matched;
  local_19 = flag;
  pBStack_18 = this;
  this_local = (BoundFlagRef *)__return_storage_ptr__;
  BasicResult<Catch::clara::detail::ParseResultType>::ok<Catch::clara::detail::ParseResultType>
            (__return_storage_ptr__,&local_20);
  return __return_storage_ptr__;
}

Assistant:

auto setFlag( bool flag ) -> ParserResult override {
            m_ref = flag;
            return ParserResult::ok( ParseResultType::Matched );
        }